

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

CURLcode cf_setup_add(Curl_easy *data,connectdata *conn,int sockindex,Curl_dns_entry *remotehost,
                     int transport,int ssl_mode)

{
  CURLcode CVar1;
  Curl_cfilter *pCStack_38;
  CURLcode result;
  Curl_cfilter *cf;
  int ssl_mode_local;
  int transport_local;
  Curl_dns_entry *remotehost_local;
  connectdata *pcStack_18;
  int sockindex_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  cf._0_4_ = ssl_mode;
  cf._4_4_ = transport;
  _ssl_mode_local = remotehost;
  remotehost_local._4_4_ = sockindex;
  pcStack_18 = conn;
  conn_local = (connectdata *)data;
  CVar1 = cf_setup_create(&stack0xffffffffffffffc8,data,remotehost,transport,ssl_mode);
  if (CVar1 == CURLE_OK) {
    Curl_conn_cf_add((Curl_easy *)conn_local,pcStack_18,remotehost_local._4_4_,pCStack_38);
  }
  return CVar1;
}

Assistant:

static CURLcode cf_setup_add(struct Curl_easy *data,
                             struct connectdata *conn,
                             int sockindex,
                             const struct Curl_dns_entry *remotehost,
                             int transport,
                             int ssl_mode)
{
  struct Curl_cfilter *cf;
  CURLcode result = CURLE_OK;

  DEBUGASSERT(data);
  result = cf_setup_create(&cf, data, remotehost, transport, ssl_mode);
  if(result)
    goto out;
  Curl_conn_cf_add(data, conn, sockindex, cf);
out:
  return result;
}